

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_WFE(DisasContext_conflict1 *s,arg_WFE *a)

{
  uint32_t uVar1;
  arg_WFE *a_local;
  DisasContext_conflict1 *s_local;
  
  uVar1 = tb_cflags((s->base).tb);
  if ((uVar1 & 0x80000) == 0) {
    gen_set_pc_im(s,(s->base).pc_next);
    (s->base).is_jmp = DISAS_TARGET_4;
  }
  return true;
}

Assistant:

static bool trans_WFE(DisasContext *s, arg_WFE *a)
{
    /*
     * When running single-threaded TCG code, use the helper to ensure that
     * the next round-robin scheduled vCPU gets a crack.  In MTTCG mode we
     * just skip this instruction.  Currently the SEV/SEVL instructions,
     * which are *one* of many ways to wake the CPU from WFE, are not
     * implemented so we can't sleep like WFI does.
     */
    if (!(tb_cflags(s->base.tb) & CF_PARALLEL)) {
        gen_set_pc_im(s, s->base.pc_next);
        s->base.is_jmp = DISAS_WFE;
    }
    return true;
}